

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::StructDeclaration::isResolved(StructDeclaration *this)

{
  size_t sVar1;
  Member *pMVar2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  
  if (this->isBeingResolved == false) {
    this->isBeingResolved = true;
    sVar1 = (this->members).numActive;
    bVar5 = true;
    if (sVar1 != 0) {
      pMVar2 = (this->members).items;
      lVar6 = 0;
      do {
        plVar3 = *(long **)((long)&(pMVar2->type).object + lVar6);
        if (((int)plVar3[5] != 1) || (cVar4 = (**(code **)(*plVar3 + 0x18))(), cVar4 == '\0')) {
          bVar5 = false;
          break;
        }
        lVar6 = lVar6 + 0x28;
      } while (sVar1 * 0x28 != lVar6);
    }
    this->isBeingResolved = false;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool isResolved() const override
        {
            if (isBeingResolved)
                return false;

            ScopedResolver scopedResolver (isBeingResolved);

            for (auto& m : members)
                if (! isResolvedAsType (m.type.get()))
                    return false;

            return true;
        }